

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcGeometricRepresentationSubContext::IfcGeometricRepresentationSubContext
          (IfcGeometricRepresentationSubContext *this)

{
  IfcGeometricRepresentationSubContext *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x118,"IfcGeometricRepresentationSubContext");
  IfcGeometricRepresentationContext::IfcGeometricRepresentationContext
            (&this->super_IfcGeometricRepresentationContext,&PTR_construction_vtable_24__00ebaee0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcGeometricRepresentationSubContext,_4UL>::
  ObjectHelper((ObjectHelper<Assimp::IFC::Schema_2x3::IfcGeometricRepresentationSubContext,_4UL> *)
               &(this->super_IfcGeometricRepresentationContext).field_0xa8,
               &PTR_construction_vtable_24__00ebaf28);
  (this->super_IfcGeometricRepresentationContext).super_IfcRepresentationContext.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>._vptr_ObjectHelper =
       (_func_int **)0xebae50;
  *(undefined8 *)&this->field_0x118 = 0xebaec8;
  *(undefined8 *)
   &(this->super_IfcGeometricRepresentationContext).super_IfcRepresentationContext.field_0x60 =
       0xebae78;
  *(undefined8 *)&(this->super_IfcGeometricRepresentationContext).field_0xa8 = 0xebaea0;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcGeometricRepresentationContext>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcGeometricRepresentationContext> *)
             &(this->super_IfcGeometricRepresentationContext).field_0xb8,(LazyObject *)0x0);
  STEP::Maybe<double>::Maybe(&this->TargetScale);
  std::__cxx11::string::string((string *)&this->TargetView);
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe(&this->UserDefinedTargetView);
  return;
}

Assistant:

IfcGeometricRepresentationSubContext() : Object("IfcGeometricRepresentationSubContext") {}